

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

void bt_skip_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
                 uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  uint uVar7;
  char *__assertion;
  byte bVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  uint32_t *local_40;
  
  local_40 = son + cyclic_pos * 2;
  uVar7 = 0;
  uVar11 = 0;
  puVar5 = son + (ulong)(cyclic_pos * 2) + 1;
  do {
    bVar12 = depth == 0;
    depth = depth - 1;
    if ((bVar12) || (uVar3 = pos - cur_match, cyclic_size <= uVar3)) {
      *puVar5 = 0;
      *local_40 = 0;
      return;
    }
    uVar9 = 0;
    if (cyclic_pos < uVar3) {
      uVar9 = cyclic_size;
    }
    uVar10 = uVar11;
    if (uVar7 < uVar11) {
      uVar10 = uVar7;
    }
    puVar6 = son + ((cyclic_pos - uVar3) + uVar9) * 2;
    bVar2 = cur[(ulong)uVar10 - (ulong)uVar3];
    bVar8 = cur[uVar10];
    if (bVar2 == bVar8) {
      uVar10 = uVar10 + 1;
      if (len_limit < uVar10) {
        __assertion = "len <= limit";
        uVar7 = 0x2e;
LAB_0019f4c8:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,uVar7,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      if ((int)len_limit < 0) {
        __assertion = "limit <= UINT32_MAX / 2";
        uVar7 = 0x2f;
        goto LAB_0019f4c8;
      }
      while( true ) {
        if (len_limit <= uVar10) goto LAB_0019f46c;
        uVar4 = *(long *)(cur + ((ulong)uVar10 - (ulong)uVar3)) - *(long *)(cur + uVar10);
        if (uVar4 != 0) break;
        uVar10 = uVar10 + 8;
      }
      uVar1 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      uVar10 = ((uint)(uVar1 >> 3) & 0x1fffffff) + uVar10;
      if (len_limit <= uVar10) {
LAB_0019f46c:
        *local_40 = *puVar6;
        *puVar5 = puVar6[1];
        return;
      }
      bVar2 = cur[(ulong)uVar10 - (ulong)uVar3];
      bVar8 = cur[uVar10];
    }
    if (bVar2 < bVar8) {
      *local_40 = cur_match;
      local_40 = puVar6 + 1;
      puVar6 = puVar5;
      puVar5 = local_40;
      uVar11 = uVar10;
    }
    else {
      *puVar5 = cur_match;
      puVar5 = puVar6;
      uVar7 = uVar10;
    }
    cur_match = *puVar5;
    puVar5 = puVar6;
  } while( true );
}

Assistant:

static void
bt_skip_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return;
		}

		uint32_t *pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);
		const uint8_t *pb = cur - delta;
		uint32_t len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			len = lzma_memcmplen(pb, cur, len + 1, len_limit);

			if (len == len_limit) {
				*ptr1 = pair[0];
				*ptr0 = pair[1];
				return;
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}